

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O0

UInt32 Bt4_MatchFinder_GetMatches(CMatchFinder *p,UInt32 *distances)

{
  uint lenLimit_00;
  UInt32 curMatch_00;
  byte *pbVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  UInt32 *pUVar8;
  undefined4 *in_RSI;
  long *in_RDI;
  Byte *lim;
  Byte *c;
  ptrdiff_t diff;
  UInt32 temp;
  UInt32 curMatch;
  Byte *cur;
  UInt32 hv;
  UInt32 lenLimit;
  UInt32 *hash;
  UInt32 pos;
  UInt32 offset;
  UInt32 maxLen;
  UInt32 d3;
  UInt32 d2;
  UInt32 h3;
  UInt32 h2;
  byte *local_70;
  uint local_38;
  uint local_34;
  uint local_2c;
  UInt32 local_c;
  
  lenLimit_00 = *(uint *)((long)in_RDI + 0x14);
  if (lenLimit_00 < 4) {
    MatchFinder_MovePos((CMatchFinder *)0x121428);
    local_c = 0;
  }
  else {
    pbVar1 = (byte *)*in_RDI;
    uVar3 = *(uint *)((long)in_RDI + (ulong)*pbVar1 * 4 + 0x78) ^ (uint)pbVar1[1];
    uVar4 = uVar3 & 0x3ff;
    uVar3 = (uint)pbVar1[2] << 8 ^ uVar3;
    uVar5 = uVar3 & 0xffff;
    uVar3 = (uVar3 ^ *(int *)((long)in_RDI + (ulong)pbVar1[3] * 4 + 0x78) << 5) &
            *(uint *)(in_RDI + 7);
    lVar2 = in_RDI[5];
    iVar7 = (int)in_RDI[1];
    local_2c = iVar7 - *(int *)(lVar2 + (ulong)uVar4 * 4);
    uVar6 = iVar7 - *(int *)(lVar2 + (ulong)(uVar5 + 0x400) * 4);
    curMatch_00 = *(UInt32 *)(lVar2 + (ulong)(uVar3 + 0x10400) * 4);
    *(int *)(lVar2 + (ulong)uVar4 * 4) = iVar7;
    *(int *)(lVar2 + (ulong)(uVar5 + 0x400) * 4) = iVar7;
    *(int *)(lVar2 + (ulong)(uVar3 + 0x10400) * 4) = iVar7;
    local_34 = 0;
    local_38 = 0;
    if ((local_2c < *(uint *)((long)in_RDI + 0x1c)) && (pbVar1[-(ulong)local_2c] == *pbVar1)) {
      local_34 = 2;
      *in_RSI = 2;
      in_RSI[1] = local_2c - 1;
      local_38 = 2;
    }
    if (((local_2c != uVar6) && (uVar6 < *(uint *)((long)in_RDI + 0x1c))) &&
       (pbVar1[-(ulong)uVar6] == *pbVar1)) {
      local_34 = 3;
      in_RSI[local_38 + 1] = uVar6 - 1;
      local_38 = local_38 + 2;
      local_2c = uVar6;
    }
    if (local_38 != 0) {
      for (local_70 = pbVar1 + local_34;
          (local_70 != pbVar1 + lenLimit_00 && (local_70[-(ulong)local_2c] == *local_70));
          local_70 = local_70 + 1) {
      }
      local_34 = (int)local_70 - (int)pbVar1;
      in_RSI[local_38 - 2] = local_34;
      if (local_34 == lenLimit_00) {
        SkipMatchesSpec(lenLimit_00,curMatch_00,*(UInt32 *)(in_RDI + 1),(Byte *)*in_RDI,
                        (CLzRef *)in_RDI[6],*(UInt32 *)(in_RDI + 3),*(UInt32 *)((long)in_RDI + 0x1c)
                        ,*(UInt32 *)((long)in_RDI + 0x3c));
        *(int *)(in_RDI + 3) = (int)in_RDI[3] + 1;
        *in_RDI = *in_RDI + 1;
        iVar7 = (int)in_RDI[1] + 1;
        *(int *)(in_RDI + 1) = iVar7;
        if (iVar7 == *(int *)((long)in_RDI + 0xc)) {
          MatchFinder_CheckLimits((CMatchFinder *)0x12179a);
        }
        return local_38;
      }
    }
    if (local_34 < 3) {
      local_34 = 3;
    }
    pUVar8 = GetMatchesSpec1(lenLimit_00,curMatch_00,*(UInt32 *)(in_RDI + 1),(Byte *)*in_RDI,
                             (CLzRef *)in_RDI[6],*(UInt32 *)(in_RDI + 3),
                             *(UInt32 *)((long)in_RDI + 0x1c),*(UInt32 *)((long)in_RDI + 0x3c),
                             in_RSI + local_38,local_34);
    local_c = (UInt32)((long)pUVar8 - (long)in_RSI >> 2);
    *(int *)(in_RDI + 3) = (int)in_RDI[3] + 1;
    *in_RDI = *in_RDI + 1;
    iVar7 = (int)in_RDI[1] + 1;
    *(int *)(in_RDI + 1) = iVar7;
    if (iVar7 == *(int *)((long)in_RDI + 0xc)) {
      MatchFinder_CheckLimits((CMatchFinder *)0x121890);
    }
  }
  return local_c;
}

Assistant:

static UInt32 Bt4_MatchFinder_GetMatches(CMatchFinder *p, UInt32 *distances)
{
  UInt32 h2, h3, d2, d3, maxLen, offset, pos;
  UInt32 *hash;
  GET_MATCHES_HEADER(4)

  HASH4_CALC;

  hash = p->hash;
  pos = p->pos;

  d2 = pos - hash[                h2];
  d3 = pos - hash[kFix3HashSize + h3];

  curMatch = hash[kFix4HashSize + hv];

  hash[                h2] = pos;
  hash[kFix3HashSize + h3] = pos;
  hash[kFix4HashSize + hv] = pos;

  maxLen = 0;
  offset = 0;
  
  if (d2 < p->cyclicBufferSize && *(cur - d2) == *cur)
  {
    distances[0] = maxLen = 2;
    distances[1] = d2 - 1;
    offset = 2;
  }
  
  if (d2 != d3 && d3 < p->cyclicBufferSize && *(cur - d3) == *cur)
  {
    maxLen = 3;
    distances[offset + 1] = d3 - 1;
    offset += 2;
    d2 = d3;
  }
  
  if (offset != 0)
  {
    UPDATE_maxLen
    distances[offset - 2] = maxLen;
    if (maxLen == lenLimit)
    {
      SkipMatchesSpec(lenLimit, curMatch, MF_PARAMS(p));
      MOVE_POS_RET;
    }
  }
  
  if (maxLen < 3)
    maxLen = 3;
  
  GET_MATCHES_FOOTER(offset, maxLen)
}